

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O1

size_t __thiscall
helix::nasdaq::itch50_handler::process_packet(itch50_handler *this,packet_view *packet)

{
  itch50_trade *m;
  size_t sVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  m = (itch50_trade *)packet->_buf;
  switch(m->MessageType) {
  case 'A':
    process_msg(this,(itch50_add_order *)m);
    goto LAB_001133e1;
  case 'C':
    process_msg(this,(itch50_order_executed_with_price *)m);
LAB_001133e1:
    sVar1 = 0x24;
    break;
  case 'D':
    process_msg(this,(itch50_order_delete *)m);
  case 'B':
    sVar1 = 0x13;
    break;
  case 'E':
    process_msg(this,(itch50_order_executed *)m);
    sVar1 = 0x1f;
    break;
  case 'F':
    process_msg(this,(itch50_add_order_mpid *)m);
    goto LAB_001133d2;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
    std::operator+(&local_40,"unknown type: ",&local_60);
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_00120b68;
    __cxa_throw(this_00,&unknown_message_type::typeinfo,std::runtime_error::~runtime_error);
  case 'H':
    process_msg(this,(itch50_stock_trading_action *)m);
    sVar1 = 0x19;
    break;
  case 'I':
    sVar1 = 0x32;
    break;
  case 'K':
    sVar1 = 0x1c;
    break;
  case 'L':
    sVar1 = 0x1a;
    break;
  case 'N':
  case 'Y':
    sVar1 = 0x14;
    break;
  case 'P':
    process_msg(this,m);
    sVar1 = 0x2c;
    break;
  case 'Q':
    process_msg(this,(itch50_cross_trade *)m);
LAB_001133d2:
    sVar1 = 0x28;
    break;
  case 'R':
    process_msg(this,(itch50_stock_directory *)m);
    sVar1 = 0x27;
    break;
  case 'S':
  case 'W':
    sVar1 = 0xc;
    break;
  case 'U':
    process_msg(this,(itch50_order_replace *)m);
  case 'V':
    sVar1 = 0x23;
    break;
  case 'X':
    process_msg(this,(itch50_order_cancel *)m);
    sVar1 = 0x17;
  }
  return sVar1;
}

Assistant:

itch50_handler::itch50_handler()
{
}